

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

PointerType * __thiscall
LLVMBC::LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
          (LLVMContext *this,Type **u,uint *u_1)

{
  PointerType *this_00;
  PointerType *t;
  PointerType *mem;
  uint *u_local_1;
  Type **u_local;
  LLVMContext *this_local;
  
  this_00 = (PointerType *)allocate(this,0x18,8);
  if (this_00 == (PointerType *)0x0) {
    std::terminate();
  }
  PointerType::PointerType(this_00,*u,*u_1);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}